

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

reference __thiscall
andres::View<TestType,_false,_std::allocator<unsigned_long>_>::operator()
          (View<TestType,_false,_std::allocator<unsigned_long>_> *this,size_t value)

{
  size_t sVar1;
  reference pTVar2;
  size_t offset;
  size_t local_20;
  
  testInvariant(this);
  sVar1 = dimension(this);
  if (sVar1 == 0) {
    marray_detail::Assert<bool>(value == 0);
    pTVar2 = this->data_;
  }
  else {
    indexToOffset(this,value,&local_20);
    pTVar2 = this->data_ + local_20;
  }
  return pTVar2;
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value
)
{
    testInvariant();
    if(dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || value == 0);
        return data_[0];
    }
    else {
        std::size_t offset;
        indexToOffset(value, offset);
        return data_[offset];
    }
}